

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void model_estimate(double *x,int N,int d,int pmax,int h)

{
  double *oup;
  double *phi;
  double *a_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  uint local_b8;
  uint local_b4;
  int qhq;
  int phq;
  int qsc;
  int psc;
  int qaic;
  int paic;
  double *a;
  double *phim;
  double *inp;
  double hq0;
  double sc0;
  double aic0;
  double hq;
  double sc;
  double aic;
  double lvar;
  double var;
  double sos;
  double wmean;
  int local_30;
  int j;
  int pq;
  int t;
  int i;
  int m;
  int h_local;
  int pmax_local;
  int d_local;
  int N_local;
  double *x_local;
  
  i = h;
  m = pmax;
  h_local = d;
  pmax_local = N;
  _d_local = x;
  oup = (double *)malloc((long)(N - d) << 3);
  if (0 < h_local) {
    pmax_local = diff(_d_local,pmax_local,h_local,oup);
  }
  t = i;
  phi = (double *)malloc((long)i << 3);
  a_00 = (double *)malloc((long)pmax_local << 3);
  sos = mean(_d_local,pmax_local);
  for (pq = 0; pq < pmax_local; pq = pq + 1) {
    oup[pq] = _d_local[pq] - sos;
  }
  ywalg(oup,pmax_local,t,phi);
  for (pq = 0; pq < pmax_local; pq = pq + 1) {
    a_00[pq] = 0.0;
  }
  for (j = t; j < pmax_local; j = j + 1) {
    a_00[j] = oup[j];
    for (pq = 0; pq < t; pq = pq + 1) {
      a_00[j] = -phi[pq] * oup[(j - pq) + -1] + a_00[j];
    }
  }
  inp = (double *)0x0;
  hq0 = 0.0;
  sc0 = 0.0;
  local_b8 = 0;
  local_b4 = 0;
  qhq = 0;
  phq = 0;
  qsc = 0;
  psc = 0;
  for (pq = 0; pq <= m; pq = pq + 1) {
    for (wmean._4_4_ = 0; (int)wmean._4_4_ <= m; wmean._4_4_ = wmean._4_4_ + 1) {
      local_30 = pq + wmean._4_4_;
      if (0 < local_30) {
        hrstep2(oup,pmax_local,t,pq,wmean._4_4_,local_30,a_00,&var,&lvar);
        dVar1 = log(lvar);
        dVar2 = dVar1 + ((double)local_30 * 2.0) / (double)pmax_local;
        dVar3 = log((double)pmax_local);
        dVar3 = dVar1 + (dVar3 * (double)local_30) / (double)pmax_local;
        dVar4 = log((double)pmax_local);
        dVar4 = log(dVar4);
        pdVar5 = (double *)(dVar1 + (dVar4 * 2.0 * (double)local_30) / (double)pmax_local);
        if ((pq == 0) && (wmean._4_4_ == 1)) {
          local_b4 = 0;
          phq = 0;
          psc = 0;
          local_b8 = 1;
          qhq = 1;
          qsc = 1;
          inp = pdVar5;
          hq0 = dVar3;
          sc0 = dVar2;
        }
        else {
          if (dVar2 < sc0) {
            psc = pq;
            qsc = wmean._4_4_;
            sc0 = dVar2;
          }
          if (dVar3 < hq0) {
            phq = pq;
            qhq = wmean._4_4_;
            hq0 = dVar3;
          }
          if ((double)pdVar5 < (double)inp) {
            local_b4 = pq;
            local_b8 = wmean._4_4_;
            inp = pdVar5;
          }
        }
        printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n",dVar2,dVar3,pdVar5,(ulong)(uint)pq,
               (ulong)wmean._4_4_);
      }
    }
  }
  printf("\n\n");
  printf("AIC Estimate : p = %d q = %d \n",(ulong)(uint)psc,(ulong)(uint)qsc);
  printf("SC Estimate  : p = %d q = %d \n",(ulong)(uint)phq,(ulong)(uint)qhq);
  printf("HQ Estimate  : p = %d q = %d \n",(ulong)local_b4,(ulong)local_b8);
  free(oup);
  free(phi);
  free(a_00);
  return;
}

Assistant:

void model_estimate(double *x, int N, int d, int pmax, int h) {
	int m, i, t, pq, j;
	double wmean, sos, var, lvar, aic, sc, hq, aic0, sc0, hq0;
	double *inp, *phim, *a;
	int paic, qaic, psc, qsc, phq, qhq;
	/*
	x - Input Time Series of length N
	d - Number of time the series has to be differenced (d = 0 when there are no trends)
	pmax - Maximum AR and MA order pmax = max(p,q)
	h - Order of AR model to be fitted to obtain residuals
	0 <= pmax <= h
	Typically pmax = 3,4 and h = 8. Increase value of h if you want to fit high order ARMA process
	*/

	inp = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(x, N, d, inp); // No need to demean x
	}

	m = h;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}
	aic0 = sc0 = hq0 = 0.0;
	paic = qaic = psc = qsc = phq = qhq = 0;

	for (i = 0; i <= pmax; ++i) {
		for (j = 0; j <= pmax; ++j) {
			pq = i + j;
			if (pq >= 1) {
				hrstep2(inp, N, m, i, j, pq, a, &sos, &var);
				lvar = log(var);
				aic = lvar + 2 * (double)pq / N;
				sc = lvar + log((double)N) * (double)pq / N;
				hq = lvar + 2 * log(log((double)N)) * (double)pq / N;
				if (i == 0 && j == 1) {
					aic0 = aic;
					sc0 = sc;
					hq0 = hq;
					paic = psc = phq = 0;
					qaic = qsc = qhq = 1;
				}
				else {
					if (aic < aic0) {
						aic0 = aic;
						paic = i;
						qaic = j;
					}
					if (sc < sc0) {
						sc0 = sc;
						psc = i;
						qsc = j;
					}
					if (hq < hq0) {
						hq0 = hq;
						phq = i;
						qhq = j;
					}
				}
				printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n", i, j, aic, sc, hq);
			}
		}
	}

	printf("\n\n");
	printf("AIC Estimate : p = %d q = %d \n", paic, qaic);
	printf("SC Estimate  : p = %d q = %d \n", psc, qsc);
	printf("HQ Estimate  : p = %d q = %d \n", phq, qhq);

	free(inp);
	free(phim);
	free(a);
}